

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O2

uint32_t __thiscall
asmjit::CodeHolder::getLabelIdByName
          (CodeHolder *this,char *name,size_t nameLength,uint32_t parentId)

{
  uint32_t uVar1;
  int iVar2;
  uint32_t uVar3;
  ZoneHashNode *__s1;
  uint uVar4;
  ZoneHashNode *pZVar5;
  ulong __n;
  ulong local_30;
  
  local_30 = nameLength;
  uVar1 = anon_unknown_32::CodeHolder_hashNameAndFixLen(name,&local_30);
  uVar3 = 0;
  if (local_30 != 0) {
    pZVar5 = (ZoneHashNode *)
             ((this->_namedLabels).super_ZoneHashBase._data +
             (ulong)uVar1 % (ulong)(this->_namedLabels).super_ZoneHashBase._bucketsCount);
    uVar4 = (uint)local_30;
    __n = local_30 & 0xffffffff;
    do {
      do {
        pZVar5 = *(ZoneHashNode **)pZVar5;
        if (pZVar5 == (ZoneHashNode *)0x0) {
          return 0;
        }
      } while (*(uint *)(pZVar5 + 0x30) != uVar4);
      if (uVar4 < 0xc) {
        __s1 = pZVar5 + 0x34;
      }
      else {
        __s1 = *(ZoneHashNode **)(pZVar5 + 0x38);
      }
      iVar2 = bcmp(__s1,name,__n);
    } while (iVar2 != 0);
    uVar3 = *(uint32_t *)(pZVar5 + 0xc);
  }
  return uVar3;
}

Assistant:

uint32_t CodeHolder::getLabelIdByName(const char* name, size_t nameLength, uint32_t parentId) noexcept {
  uint32_t hVal = CodeHolder_hashNameAndFixLen(name, nameLength);
  if (ASMJIT_UNLIKELY(!nameLength)) return 0;

  LabelEntry* le = _namedLabels.get(LabelByName(name, nameLength, hVal));
  return le ? le->getId() : static_cast<uint32_t>(0);
}